

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charMapper.cpp
# Opt level: O2

CharMapper<unsigned_char> * gmlc::utilities::hexMapper(void)

{
  long lVar1;
  CharMapper<unsigned_char> *in_RDI;
  
  memset(in_RDI,0xff,0x100);
  for (lVar1 = 0; (uchar)lVar1 != '\n'; lVar1 = lVar1 + 1) {
    (in_RDI->key)._M_elems[lVar1 + 0x30] = (uchar)lVar1;
  }
  for (lVar1 = -6; lVar1 != 0; lVar1 = lVar1 + 1) {
    (in_RDI->key)._M_elems[lVar1 + 0x47] = (char)lVar1 + '\x10';
  }
  for (lVar1 = -6; lVar1 != 0; lVar1 = lVar1 + 1) {
    (in_RDI->key)._M_elems[lVar1 + 0x67] = (char)lVar1 + '\x10';
  }
  return in_RDI;
}

Assistant:

CharMapper<unsigned char> hexMapper()
{
    CharMapper<unsigned char> dMap(0xFF);
    unsigned char val = 0;
    for (unsigned char indexChar = '0'; indexChar <= '9'; ++indexChar) {
        dMap.addKey(indexChar, val);
        ++val;
    }
    for (unsigned char indexChar = 'A'; indexChar <= 'F'; ++indexChar) {
        dMap.addKey(indexChar, val);
        ++val;
    }
    val = 10;
    for (unsigned char indexChar = 'a'; indexChar <= 'f'; ++indexChar) {
        dMap.addKey(indexChar, val);
        ++val;
    }
    return dMap;
}